

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
vector(vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_> *this
      ,size_t count,Bin *value,polymorphic_allocator<pbrt::AliasTable::Bin> *alloc)

{
  undefined8 *in_RCX;
  Bin *in_RDX;
  vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_> *in_RSI;
  polymorphic_allocator<pbrt::AliasTable::Bin> *in_RDI;
  size_t i;
  vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_> *local_28;
  
  in_RDI->memoryResource = (memory_resource *)*in_RCX;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[2].memoryResource = (memory_resource *)0x0;
  in_RDI[3].memoryResource = (memory_resource *)0x0;
  reserve(in_RSI,(size_t)in_RDX);
  for (local_28 = (vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
                   *)0x0; local_28 < in_RSI;
      local_28 = (vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
                  *)((long)&(local_28->alloc).memoryResource + 1)) {
    pmr::polymorphic_allocator<pbrt::AliasTable::Bin>::
    construct<pbrt::AliasTable::Bin,pbrt::AliasTable::Bin_const&>
              (in_RDI,(Bin *)((long)in_RDI[1].memoryResource + (long)local_28 * 0xc),in_RDX);
  }
  in_RDI[3].memoryResource = (memory_resource *)in_RSI;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }